

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-hang-loop.c
# Opt level: O2

int run_test_udp_send_hang_loop(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  int64_t eval_b;
  int64_t eval_a;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_idle_init(puVar2,&idle_handle);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_ip4_addr("192.0.2.3",0x23a3,&addr);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_udp_init(puVar2,&client);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        buf = uv_buf_init(send_data,0x400);
        iVar1 = uv_idle_start(&idle_handle,idle_cb);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          puVar2 = uv_default_loop();
          uv_run(puVar2,UV_RUN_DEFAULT);
          eval_a = (int64_t)loop_hang_called;
          eval_b = 1000;
          if (eval_a < 0x3e9) {
            pcVar4 = ">";
            pcVar5 = "1000";
            pcVar3 = "loop_hang_called";
            uVar6 = 0x5f;
          }
          else {
            puVar2 = uv_default_loop();
            uv_walk(puVar2,close_walk_cb,(void *)0x0);
            uv_run(puVar2,UV_RUN_DEFAULT);
            eval_a = 0;
            puVar2 = uv_default_loop();
            iVar1 = uv_loop_close(puVar2);
            eval_b = (int64_t)iVar1;
            if (eval_b == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar4 = "==";
            pcVar5 = "uv_loop_close(uv_default_loop())";
            pcVar3 = "0";
            uVar6 = 0x61;
          }
        }
        else {
          pcVar4 = "==";
          pcVar5 = "0";
          pcVar3 = "uv_idle_start(&idle_handle, idle_cb)";
          uVar6 = 0x5b;
        }
      }
      else {
        pcVar4 = "==";
        pcVar5 = "0";
        pcVar3 = "uv_udp_init(uv_default_loop(), &client)";
        uVar6 = 0x57;
      }
    }
    else {
      pcVar4 = "==";
      pcVar5 = "0";
      pcVar3 = "uv_ip4_addr(\"192.0.2.3\", 9123, &addr)";
      uVar6 = 0x55;
    }
  }
  else {
    pcVar4 = "==";
    pcVar5 = "0";
    pcVar3 = "uv_idle_init(uv_default_loop(), &idle_handle)";
    uVar6 = 0x50;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-hang-loop.c"
          ,uVar6,pcVar3,pcVar4,pcVar5,eval_a,pcVar4,eval_b);
  abort();
}

Assistant:

TEST_IMPL(udp_send_hang_loop) {
  ASSERT_OK(uv_idle_init(uv_default_loop(), &idle_handle));

  /* 192.0.2.0/24 is "TEST-NET" and reserved for documentation.
   * Good for us, though. Since we want to have something unreachable.
   */
  ASSERT_OK(uv_ip4_addr("192.0.2.3", TEST_PORT, &addr));

  ASSERT_OK(uv_udp_init(uv_default_loop(), &client));

  buf = uv_buf_init(send_data, sizeof(send_data));

  ASSERT_OK(uv_idle_start(&idle_handle, idle_cb));

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_GT(loop_hang_called, 1000);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}